

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O1

void __thiscall duckdb::WALWriteState::WriteUpdate(WALWriteState *this,UpdateInfo *info)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  uint uVar1;
  ColumnData *this_01;
  UpdateSegment *this_02;
  idx_t iVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  ColumnData *pCVar5;
  unsigned_long uVar6;
  WriteAheadLog *this_03;
  unsigned_long *puVar7;
  DataTableInfo *table_info;
  DataChunk *this_04;
  pointer pDVar8;
  Allocator *allocator;
  reference pvVar9;
  unsigned_long *puVar10;
  type chunk;
  ulong uVar11;
  unsigned_long *puVar12;
  UndoFlags new_op;
  vector<unsigned_long,_true> column_indexes;
  vector<duckdb::LogicalType,_true> update_types;
  SelectionVector sel;
  vector<unsigned_long,_true> local_88;
  WALWriteState *local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  SelectionVector local_50;
  LogicalType *local_38;
  
  this_01 = info->segment->column_data;
  table_info = ColumnData::GetTableInfo(this_01);
  SwitchTable(this,table_info,new_op);
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &this_01->type;
  if ((this_01->type).id_ == VALIDITY) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_68,
               &LogicalType::BOOLEAN);
  }
  else {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&local_68,local_38);
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_68,
             &LogicalType::ROW_TYPE);
  this_04 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this_04);
  this_00 = &this->update_chunk;
  ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
            ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)this_00,
             this_04);
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(pDVar8,allocator,(vector<duckdb::LogicalType,_true> *)&local_68,0x800);
  this_02 = info->segment;
  iVar2 = info->vector_index;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,0);
  UpdateSegment::FetchCommitted(this_02,iVar2,pvVar9);
  local_70 = this;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,1);
  pdVar3 = pvVar9->data;
  iVar2 = info->vector_index;
  iVar4 = this_01->start;
  local_50.sel_vector = UpdateInfo::GetTuples(info);
  uVar1 = info->N;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    do {
      *(ulong *)(pdVar3 + (ulong)local_50.sel_vector[uVar11] * 8) =
           (ulong)local_50.sel_vector[uVar11] + iVar2 * 0x800 + iVar4;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  if (local_38->id_ == VALIDITY) {
    pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,0);
    uVar1 = info->N;
    if ((ulong)uVar1 != 0) {
      pdVar3 = pvVar9->data;
      uVar11 = 0;
      do {
        pdVar3[local_50.sel_vector[uVar11]] = '\0';
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
  }
  local_50.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  DataChunk::Slice(pDVar8,&local_50,(ulong)info->N);
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (unsigned_long *)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  pCVar5 = (this_01->parent).ptr;
  while (pCVar5 != (ColumnData *)0x0) {
    if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                 (iterator)
                 local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&this_01->column_index);
    }
    else {
      *local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = this_01->column_index;
      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    optional_ptr<duckdb::ColumnData,_true>::CheckValid(&this_01->parent);
    this_01 = (this_01->parent).ptr;
    pCVar5 = (this_01->parent).ptr;
  }
  if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
               (iterator)
               local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&info->column_index);
  }
  else {
    *local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = info->column_index;
    local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  puVar12 = local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  puVar7 = local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start < puVar12 &&
      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      puVar10 = puVar7 + 1;
      uVar6 = *puVar7;
      *puVar7 = *puVar12;
      *puVar12 = uVar6;
      puVar12 = puVar12 + -1;
      puVar7 = puVar10;
    } while (puVar10 < puVar12);
  }
  this_03 = local_70->log;
  chunk = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    (this_00);
  WriteAheadLog::WriteUpdate(this_03,chunk,&local_88);
  if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  return;
}

Assistant:

void WALWriteState::WriteUpdate(UpdateInfo &info) {
	// switch to the current table, if necessary
	auto &column_data = info.segment->column_data;
	auto &table_info = column_data.GetTableInfo();

	SwitchTable(&table_info, UndoFlags::UPDATE_TUPLE);

	// initialize the update chunk
	vector<LogicalType> update_types;
	if (column_data.type.id() == LogicalTypeId::VALIDITY) {
		update_types.emplace_back(LogicalType::BOOLEAN);
	} else {
		update_types.push_back(column_data.type);
	}
	update_types.emplace_back(LogicalType::ROW_TYPE);

	update_chunk = make_uniq<DataChunk>();
	update_chunk->Initialize(Allocator::DefaultAllocator(), update_types);

	// fetch the updated values from the base segment
	info.segment->FetchCommitted(info.vector_index, update_chunk->data[0]);

	// write the row ids into the chunk
	auto row_ids = FlatVector::GetData<row_t>(update_chunk->data[1]);
	idx_t start = column_data.start + info.vector_index * STANDARD_VECTOR_SIZE;
	auto tuples = info.GetTuples();
	for (idx_t i = 0; i < info.N; i++) {
		row_ids[tuples[i]] = UnsafeNumericCast<int64_t>(start + tuples[i]);
	}
	if (column_data.type.id() == LogicalTypeId::VALIDITY) {
		// zero-initialize the booleans
		// FIXME: this is only required because of NullValue<T> in Vector::Serialize...
		auto booleans = FlatVector::GetData<bool>(update_chunk->data[0]);
		for (idx_t i = 0; i < info.N; i++) {
			auto idx = tuples[i];
			booleans[idx] = false;
		}
	}
	SelectionVector sel(tuples);
	update_chunk->Slice(sel, info.N);

	// construct the column index path
	vector<column_t> column_indexes;
	reference<const ColumnData> current_column_data = column_data;
	while (current_column_data.get().HasParent()) {
		column_indexes.push_back(current_column_data.get().column_index);
		current_column_data = current_column_data.get().Parent();
	}
	column_indexes.push_back(info.column_index);
	std::reverse(column_indexes.begin(), column_indexes.end());

	log.WriteUpdate(*update_chunk, column_indexes);
}